

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

void __thiscall pybind11::capsule::capsule(capsule *this,object *o)

{
  PyObject *pPVar1;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (this->super_object).super_handle.m_ptr = (o->super_handle).m_ptr;
  (o->super_handle).m_ptr = (PyObject *)0x0;
  pPVar1 = (this->super_object).super_handle.m_ptr;
  if ((pPVar1 != (PyObject *)0x0) && (pPVar1->ob_type != (PyTypeObject *)&PyCapsule_Type)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,((this->super_object).super_handle.m_ptr)->ob_type->tp_name,
               (allocator<char> *)&local_88);
    std::operator+(&local_48,"Object of type \'",&local_68);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
    local_88 = (long *)*plVar2;
    plVar3 = plVar2 + 2;
    if (local_88 == plVar3) {
      local_78 = *plVar3;
      lStack_70 = plVar2[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar3;
    }
    local_80 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::runtime_error::runtime_error(this_00,(string *)&local_88);
    *(undefined ***)this_00 = &PTR__runtime_error_0013fb60;
    __cxa_throw(this_00,&type_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

object(object &&other) noexcept : handle(other) { other.m_ptr = nullptr; }